

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

int Ssw_ClassesPrepareRehash(Ssw_Cla_t *p,Vec_Ptr_t *vCands,int fConstCorr)

{
  int *piVar1;
  Aig_Obj_t **pClass;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  void *__ptr;
  void *__ptr_00;
  Aig_Obj_t *pAVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Aig_Obj_t **ppAVar12;
  uint uVar13;
  int iVar14;
  uint local_4c;
  
  iVar6 = vCands->nSize;
  uVar7 = iVar6 / 2 - 1;
  do {
    do {
      uVar13 = uVar7 + 1;
      uVar2 = uVar7 & 1;
      uVar7 = uVar13;
    } while (uVar2 != 0);
    uVar11 = 3;
    do {
      iVar14 = (int)uVar11;
      if (uVar13 < (uint)(iVar14 * iVar14)) {
        __ptr = calloc((long)(int)uVar13,8);
        __ptr_00 = calloc((long)p->pAig->vObjs->nSize,8);
        p->nCands1 = 0;
        iVar14 = 0;
        local_4c = 0;
        while( true ) {
          if (iVar6 <= iVar14) {
            iVar14 = 0;
            uVar7 = 0;
            do {
              if (iVar6 <= iVar14) {
                p->pMemClassesFree = p->pMemClassesFree + uVar7;
                if (local_4c != uVar7) {
                  __assert_fail("nEntries == nEntries2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                                ,0x242,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)"
                               );
                }
                free(__ptr);
                free(__ptr_00);
                iVar6 = Ssw_ClassesRefine(p,1);
                return iVar6;
              }
              pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(vCands,iVar14);
              lVar10 = (long)pAVar8->Id;
              uVar2 = p->pClassSizes[lVar10];
              if ((ulong)uVar2 != 0) {
                if ((int)uVar2 < 2) {
                  __assert_fail("nNodes > 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                                ,0x232,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)"
                               );
                }
                ppAVar12 = p->pMemClassesFree;
                pClass = ppAVar12 + uVar7;
                *pClass = pAVar8;
                ppAVar12 = ppAVar12 + (ulong)uVar7 + (ulong)uVar2;
                lVar9 = lVar10;
                while( true ) {
                  ppAVar12 = ppAVar12 + -1;
                  pAVar3 = *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8);
                  if (pAVar3 == (Aig_Obj_t *)0x0) break;
                  *ppAVar12 = pAVar3;
                  lVar9 = (long)pAVar3->Id;
                }
                p->pClassSizes[lVar10] = 0;
                Ssw_ObjAddClass(p,pAVar8,pClass,uVar2);
                uVar7 = uVar7 + uVar2;
              }
              iVar14 = iVar14 + 1;
              iVar6 = vCands->nSize;
            } while( true );
          }
          pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(vCands,iVar14);
          if (p->pClassSizes[pAVar8->Id] != 0) break;
          Aig_ObjSetRepr(p->pAig,pAVar8,(Aig_Obj_t *)0x0);
          iVar6 = (*p->pFuncNodeIsConst)(p->pManData,pAVar8);
          if (iVar6 == 0) {
            if (fConstCorr == 0) {
              uVar7 = (*p->pFuncNodeHash)(p->pManData,pAVar8);
              pAVar3 = *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar7 % uVar13) * 8);
              if (pAVar3 == (Aig_Obj_t *)0x0) {
                *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar7 % uVar13) * 8) = pAVar8;
              }
              else {
                Aig_ObjSetRepr(p->pAig,pAVar8,pAVar3);
                lVar9 = (long)pAVar3->Id;
                lVar10 = *(long *)((long)__ptr_00 + lVar9 * 8);
                piVar4 = p->pClassSizes;
                if (lVar10 == 0) {
                  piVar1 = piVar4 + lVar9;
                  *piVar1 = *piVar1 + 1;
                  local_4c = local_4c + 1;
                  lVar9 = (long)pAVar3->Id;
                  lVar10 = *(long *)((long)__ptr_00 + lVar9 * 8);
                }
                *(long *)((long)__ptr_00 + (long)pAVar8->Id * 8) = lVar10;
                *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8) = pAVar8;
                piVar4 = piVar4 + lVar9;
                *piVar4 = *piVar4 + 1;
                local_4c = local_4c + 1;
              }
            }
          }
          else {
            Ssw_ObjSetConst1Cand(p->pAig,pAVar8);
            p->nCands1 = p->nCands1 + 1;
          }
          iVar14 = iVar14 + 1;
          iVar6 = vCands->nSize;
        }
        __assert_fail("p->pClassSizes[pObj->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x205,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
      }
      uVar5 = (ulong)uVar13 % uVar11;
      uVar11 = (ulong)(iVar14 + 2);
    } while ((int)uVar5 != 0);
  } while( true );
}

Assistant:

int Ssw_ClassesPrepareRehash( Ssw_Cla_t * p, Vec_Ptr_t * vCands, int fConstCorr )
{
//    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Vec_PtrSize(vCands)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );

    // sort through the candidates
    nEntries = 0;
    p->nCands1 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        assert( p->pClassSizes[pObj->Id] == 0 );
        Aig_ObjSetRepr( p->pAig, pObj, NULL );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Ssw_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        if ( fConstCorr )
            continue;
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
        }
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Ssw_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Ssw_ObjSetNext( ppNexts, pObj, Ssw_ObjNext( ppNexts, pRepr ) );
            Ssw_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClassesFree + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Ssw_ObjNext(ppNexts, pObj), k = 1; pTemp;
              pTemp = Ssw_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Ssw_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    p->pMemClassesFree += nEntries2;
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    return Ssw_ClassesRefine( p, 1 );
}